

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O0

int passwd_callback(char *buf,int num,int encrypting,void *password)

{
  int iVar1;
  size_t uznum;
  int klen;
  void *password_local;
  int encrypting_local;
  int num_local;
  char *buf_local;
  
  if (((encrypting == 0) && (-1 < num)) && (password != (void *)0x0)) {
    uznum = strlen((char *)password);
    iVar1 = curlx_uztosi(uznum);
    if (iVar1 < num) {
      memcpy(buf,password,(long)(iVar1 + 1));
      return iVar1;
    }
  }
  return 0;
}

Assistant:

static int passwd_callback(char *buf, int num, int encrypting,
                           void *password)
{
  DEBUGASSERT(0 == encrypting);

  if(!encrypting && num >= 0 && password) {
    int klen = curlx_uztosi(strlen((char *)password));
    if(num > klen) {
      memcpy(buf, password, klen + 1);
      return klen;
    }
  }
  return 0;
}